

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::CoverpointSyntax::CoverpointSyntax
          (CoverpointSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          DataTypeSyntax *type,NamedLabelSyntax *label,Token coverpoint,ExpressionSyntax *expr,
          CoverageIffClauseSyntax *iff,Token openBrace,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token closeBrace,Token emptySemi)

{
  bool bVar1;
  DataTypeSyntax *pDVar2;
  ExpressionSyntax *pEVar3;
  reference ppMVar4;
  SyntaxNode *in_RCX;
  DataTypeSyntax *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  undefined8 in_stack_00000010;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  __extent_storage<18446744073709551615UL> in_stack_00000048;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_ffffffffffffff78;
  SyntaxList<slang::syntax::MemberSyntax> *this_00;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *this_01;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffb0;
  ExpressionSyntax *local_40;
  DataTypeSyntax *local_38;
  SyntaxNode *local_30;
  DataTypeSyntax *local_28;
  undefined8 local_10;
  SyntaxNode *local_8;
  
  this_01 = (span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)&__end2;
  this_00 = (SyntaxList<slang::syntax::MemberSyntax> *)&stack0x00000018;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_10 = in_R8;
  local_8 = in_R9;
  MemberSyntax::MemberSyntax
            ((MemberSyntax *)in_stack_ffffffffffffffb0._M_current,
             (SyntaxKind)((ulong)in_stack_ffffffffffffffa8 >> 0x20),in_stack_ffffffffffffffa0);
  local_38 = local_28;
  not_null<slang::syntax::DataTypeSyntax_*>::not_null<slang::syntax::DataTypeSyntax_*>
            ((not_null<slang::syntax::DataTypeSyntax_*> *)&in_RDI[3].parent,&local_38);
  in_RDI[3].previewNode = local_30;
  *(undefined8 *)(in_RDI + 4) = local_10;
  in_RDI[4].parent = local_8;
  not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
            ((not_null<slang::syntax::ExpressionSyntax_*> *)&in_RDI[4].previewNode,&local_40);
  *(undefined8 *)(in_RDI + 5) = in_stack_00000010;
  in_RDI[5].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[5].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList(this_00,in_stack_ffffffffffffff78);
  in_RDI[8].parent = (SyntaxNode *)this_01->_M_ptr;
  in_RDI[8].previewNode = (SyntaxNode *)(this_01->_M_extent)._M_extent_value;
  *(SyntaxList<slang::syntax::MemberSyntax> **)(in_RDI + 9) = __range2;
  in_RDI[9].parent = (SyntaxNode *)in_stack_00000048._M_extent_value;
  pDVar2 = not_null<slang::syntax::DataTypeSyntax_*>::operator->
                     ((not_null<slang::syntax::DataTypeSyntax_*> *)0xa273ac);
  (pDVar2->super_ExpressionSyntax).super_SyntaxNode.parent = in_RDI;
  if (in_RDI[3].previewNode != (SyntaxNode *)0x0) {
    (in_RDI[3].previewNode)->parent = in_RDI;
  }
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa273da);
  (pEVar3->super_SyntaxNode).parent = in_RDI;
  if (*(long *)(in_RDI + 5) != 0) {
    *(SyntaxNode **)(*(long *)(in_RDI + 5) + 8) = in_RDI;
  }
  in_RDI[6].previewNode = in_RDI;
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff78);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppMVar4 = __gnu_cxx::
              __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffb0);
    ((*ppMVar4)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffb0);
  }
  return;
}

Assistant:

CoverpointSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, DataTypeSyntax& type, NamedLabelSyntax* label, Token coverpoint, ExpressionSyntax& expr, CoverageIffClauseSyntax* iff, Token openBrace, const SyntaxList<MemberSyntax>& members, Token closeBrace, Token emptySemi) :
        MemberSyntax(SyntaxKind::Coverpoint, attributes), type(&type), label(label), coverpoint(coverpoint), expr(&expr), iff(iff), openBrace(openBrace), members(members), closeBrace(closeBrace), emptySemi(emptySemi) {
        this->type->parent = this;
        if (this->label) this->label->parent = this;
        this->expr->parent = this;
        if (this->iff) this->iff->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }